

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

BVec4 __thiscall tcu::getTextureFormatChannelMask(tcu *this,TextureFormat *format)

{
  Channel CVar1;
  Channel CVar2;
  Channel CVar3;
  TextureSwizzle *pTVar4;
  
  pTVar4 = getChannelReadSwizzle(format->order);
  CVar1 = pTVar4->components[1];
  CVar2 = pTVar4->components[2];
  CVar3 = pTVar4->components[3];
  *this = (tcu)(pTVar4->components[0] < CHANNEL_ZERO);
  this[1] = (tcu)(CVar1 < CHANNEL_ZERO);
  this[2] = (tcu)(CVar2 < CHANNEL_ZERO);
  this[3] = (tcu)(CVar3 < CHANNEL_ZERO);
  return (BVec4)SUB84(this,0);
}

Assistant:

BVec4 getTextureFormatChannelMask (const TextureFormat& format)
{
	const TextureSwizzle::Channel* const map = getChannelReadSwizzle(format.order).components;
	return BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
				 deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
}